

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS ref_geom_inspect(REF_GEOM ref_geom)

{
  int iVar1;
  uint local_14;
  REF_INT geom;
  REF_GEOM ref_geom_local;
  
  printf("ref_geom = %p\n",ref_geom);
  printf(" n = %d, max = %d\n",(ulong)(uint)ref_geom->n,(ulong)(uint)ref_geom->max);
  for (local_14 = 0; (int)local_14 < ref_geom->max; local_14 = local_14 + 1) {
    iVar1 = ref_geom->descr[(int)(local_14 * 6)];
    if (iVar1 == 0) {
      printf("%d node: %d id, %d jump, %d degen, %d global\n",(ulong)local_14,
             (ulong)(uint)ref_geom->descr[(int)(local_14 * 6 + 1)],
             (ulong)(uint)ref_geom->descr[(int)(local_14 * 6 + 3)],
             (ulong)(uint)ref_geom->descr[(int)(local_14 * 6 + 4)],
             (ulong)(uint)ref_geom->descr[(int)(local_14 * 6 + 5)]);
    }
    else if (iVar1 == 1) {
      printf("%d edge: %d id, %d jump, %d degen, %d global, t=%e\n",
             ref_geom->param[(int)(local_14 << 1)],(ulong)local_14,
             (ulong)(uint)ref_geom->descr[(int)(local_14 * 6 + 1)],
             (ulong)(uint)ref_geom->descr[(int)(local_14 * 6 + 3)],
             (ulong)(uint)ref_geom->descr[(int)(local_14 * 6 + 5)],
             (ulong)(uint)ref_geom->descr[(int)(local_14 * 6 + 4)]);
    }
    else if (iVar1 == 2) {
      printf("%d face: %d id, %d jump, %d degen, %d global, uv= %e %e\n",
             ref_geom->param[(int)(local_14 << 1)],ref_geom->param[(int)(local_14 * 2 + 1)],
             (ulong)local_14,(ulong)(uint)ref_geom->descr[(int)(local_14 * 6 + 1)],
             (ulong)(uint)ref_geom->descr[(int)(local_14 * 6 + 3)],
             (ulong)(uint)ref_geom->descr[(int)(local_14 * 6 + 5)],
             (ulong)(uint)ref_geom->descr[(int)(local_14 * 6 + 4)]);
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_geom_inspect(REF_GEOM ref_geom) {
  REF_INT geom;
  printf("ref_geom = %p\n", (void *)ref_geom);
  printf(" n = %d, max = %d\n", ref_geom_n(ref_geom), ref_geom_max(ref_geom));
  for (geom = 0; geom < ref_geom_max(ref_geom); geom++) {
    switch (ref_geom_type(ref_geom, geom)) {
      case REF_GEOM_NODE:
        printf("%d node: %d id, %d jump, %d degen, %d global\n", geom,
               ref_geom_id(ref_geom, geom), ref_geom_jump(ref_geom, geom),
               ref_geom_degen(ref_geom, geom), ref_geom_node(ref_geom, geom));
        break;
      case REF_GEOM_EDGE:
        printf("%d edge: %d id, %d jump, %d degen, %d global, t=%e\n", geom,
               ref_geom_id(ref_geom, geom), ref_geom_jump(ref_geom, geom),
               ref_geom_node(ref_geom, geom), ref_geom_degen(ref_geom, geom),
               ref_geom_param(ref_geom, 0, geom));
        break;
      case REF_GEOM_FACE:
        printf("%d face: %d id, %d jump, %d degen, %d global, uv= %e %e\n",
               geom, ref_geom_id(ref_geom, geom), ref_geom_jump(ref_geom, geom),
               ref_geom_node(ref_geom, geom), ref_geom_degen(ref_geom, geom),
               ref_geom_param(ref_geom, 0, geom),
               ref_geom_param(ref_geom, 1, geom));
        break;
    }
  }

  return REF_SUCCESS;
}